

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O3

void __thiscall
FSChaCha20::FSChaCha20(FSChaCha20 *this,Span<const_std::byte> key,uint32_t rekey_interval)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ChaCha20Aligned::ChaCha20Aligned((ChaCha20Aligned *)this,key);
  (this->m_chacha20).m_bufleft = 0;
  this->m_rekey_interval = rekey_interval;
  this->m_chunk_counter = 0;
  this->m_rekey_counter = 0;
  if (key.m_size != 0x20) {
    __assert_fail("key.size() == KEYLEN",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0x15b,"FSChaCha20::FSChaCha20(Span<const std::byte>, uint32_t)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

FSChaCha20::FSChaCha20(Span<const std::byte> key, uint32_t rekey_interval) noexcept :
    m_chacha20(key), m_rekey_interval(rekey_interval)
{
    assert(key.size() == KEYLEN);
}